

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vk_mem_alloc.h
# Opt level: O1

void __thiscall VmaBlockVector::IncrementallySortBlocks(VmaBlockVector *this)

{
  undefined1 auVar1 [16];
  VmaDeviceMemoryBlock **ppVVar2;
  int iVar3;
  int iVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ulong uVar5;
  undefined1 auVar6 [16];
  
  if (((this->m_IncrementalSort == true) && (this->m_Algorithm != 4)) &&
     (1 < (this->m_Blocks).m_Count)) {
    uVar5 = 1;
    do {
      iVar3 = (*(this->m_Blocks).m_pArray[uVar5 - 1]->m_pMetadata->_vptr_VmaBlockMetadata[6])();
      iVar4 = (*(this->m_Blocks).m_pArray[uVar5]->m_pMetadata->_vptr_VmaBlockMetadata[6])();
      if (CONCAT44(extraout_var_00,iVar4) < CONCAT44(extraout_var,iVar3)) {
        ppVVar2 = (this->m_Blocks).m_pArray;
        auVar1 = *(undefined1 (*) [16])(ppVVar2 + (uVar5 - 1));
        auVar6._0_8_ = auVar1._8_8_;
        auVar6._8_4_ = auVar1._0_4_;
        auVar6._12_4_ = auVar1._4_4_;
        *(undefined1 (*) [16])(ppVVar2 + (uVar5 - 1)) = auVar6;
        return;
      }
      uVar5 = uVar5 + 1;
    } while (uVar5 < (this->m_Blocks).m_Count);
  }
  return;
}

Assistant:

void VmaBlockVector::IncrementallySortBlocks()
{
    if (!m_IncrementalSort)
        return;
    if (m_Algorithm != VMA_POOL_CREATE_LINEAR_ALGORITHM_BIT)
    {
        // Bubble sort only until first swap.
        for (size_t i = 1; i < m_Blocks.size(); ++i)
        {
            if (m_Blocks[i - 1]->m_pMetadata->GetSumFreeSize() > m_Blocks[i]->m_pMetadata->GetSumFreeSize())
            {
                VMA_SWAP(m_Blocks[i - 1], m_Blocks[i]);
                return;
            }
        }
    }
}